

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O3

int fy_fetch_key(fy_parser *fyp,int c)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  fy_atom *pfVar4;
  fy_atom *pfVar5;
  fy_atom *pfVar6;
  fy_token *pfVar7;
  char *pcVar8;
  int iVar9;
  size_t sVar10;
  fy_atom local_a8;
  undefined8 uStack_70;
  undefined1 auStack_68 [8];
  fy_diag_report_ctx local_60;
  fy_token_list *local_38;
  
  pfVar4 = (fy_atom *)auStack_68;
  pfVar5 = (fy_atom *)auStack_68;
  if (c == 0x3f) {
    if (fyp->flow_level == 0) {
      if ((fyp->field_0x70 & 8) != 0) {
        sVar10 = fyp->current_input_pos;
        iVar9 = fyp->line;
        iVar3 = fyp->column;
        if (fyp->indent < iVar3) {
          uStack_70 = 0x12f4b2;
          iVar2 = fy_push_indent(fyp,iVar3,true);
          if (iVar2 != 0) {
            pcVar8 = "fy_push_indent() failed";
            iVar3 = 0x79a;
            pfVar5 = (fy_atom *)auStack_68;
            goto LAB_0012f54c;
          }
          local_38 = &fyp->queued_tokens;
          pfVar4 = &local_a8;
          pfVar5 = fy_fill_atom(fyp,0,pfVar4);
          pfVar7 = fy_token_queue_internal(fyp,local_38,FYTT_BLOCK_MAPPING_START,pfVar5);
          if (pfVar7 == (fy_token *)0x0) {
            pcVar8 = "fy_token_queue_internal() failed";
            iVar3 = 0x79f;
            goto LAB_0012f6df;
          }
        }
        goto LAB_0012f519;
      }
      local_60.has_override = false;
      local_60._17_7_ = 0;
      local_60.override_file = (char *)0x0;
      local_60.override_line = 0;
      local_60.override_column = 0;
      local_60.type = FYET_ERROR;
      local_60.module = FYEM_SCAN;
      pfVar4 = fy_fill_atom_at(fyp,0,1,&local_a8);
      local_60.fyt = fy_token_create(FYTT_INPUT_MARKER,pfVar4);
      pcVar8 = "invalid mapping key (not allowed in this context)";
    }
    else {
      iVar3 = fyp->column;
      if (fyp->indent < iVar3) {
        sVar10 = fyp->current_input_pos;
        iVar9 = fyp->line;
        pfVar4 = (fy_atom *)auStack_68;
LAB_0012f519:
        *(undefined8 *)&pfVar4[-1].increment = 0x12f526;
        iVar2 = fy_remove_simple_key(fyp,FYTT_KEY);
        if (iVar2 == 0) {
          uVar1 = fyp->column;
          local_38 = (fy_token_list *)CONCAT44(local_38._4_4_,fyp->flow_level);
          fyp->pending_complex_key_column = uVar1;
          (fyp->pending_complex_key_mark).input_pos = sVar10;
          (fyp->pending_complex_key_mark).line = iVar9;
          (fyp->pending_complex_key_mark).column = iVar3;
          pfVar4[-1].fyi = (fy_input *)(ulong)uVar1;
          pfVar4[-1].storage_hint = 0x12f5c0;
          fy_parser_diag(fyp,0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                         ,0x7ab,"fy_fetch_key","pending_complex_key_column %d");
          pfVar5 = (fy_atom *)&pfVar4[-2].increment;
          pfVar4[-2].fyi = (fy_input *)0x12f5d9;
          pfVar6 = fy_fill_atom(fyp,1,pfVar5);
          pfVar4[-2].fyi = (fy_input *)0x12f5eb;
          pfVar7 = fy_token_queue(fyp,FYTT_KEY,pfVar6);
          if (pfVar7 == (fy_token *)0x0) {
            pcVar8 = "fy_token_queue() failed";
            iVar3 = 0x7af;
            pfVar4 = pfVar5;
LAB_0012f6df:
            *(undefined8 *)&pfVar4[-1].increment = 0x12f6e6;
            fy_parser_diag(fyp,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,iVar3,"fy_fetch_key",pcVar8);
            return 0;
          }
          *(ushort *)&fyp->field_0x70 =
               ((ushort)*(undefined4 *)&fyp->field_0x70 & 0xfff7) + (ushort)((int)local_38 == 0) * 8
          ;
          pcVar8 = "false";
          if ((int)local_38 == 0) {
            pcVar8 = "true";
          }
          pfVar4[-2].storage_hint = (size_t)pcVar8;
          pfVar4[-2].end_mark.line = 0x12f64e;
          pfVar4[-2].end_mark.column = 0;
          fy_parser_diag(fyp,0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                         ,0x7b2,"fy_fetch_key","simple_key_allowed -> %s\n");
          while( true ) {
            pfVar4[-2].fyi = (fy_input *)0x12f668;
            iVar3 = fy_parse_peek_at_offset(fyp,0);
            if ((iVar3 != 9) && (iVar3 != 0x20)) break;
            pfVar4[-2].fyi = (fy_input *)0x12f65e;
            fy_advance(fyp,iVar3);
          }
          if (iVar3 != 0x23) {
            return 0;
          }
          pfVar4[-2].fyi = (fy_input *)0x12f68e;
          iVar3 = fy_scan_comment(fyp,pfVar7->comment + 1,false);
          if (iVar3 == 0) {
            return 0;
          }
          pcVar8 = "fy_scan_comment() failed";
          iVar3 = 0x7bc;
        }
        else {
          pcVar8 = "fy_remove_simple_key() failed";
          iVar3 = 0x7a4;
          pfVar5 = pfVar4;
        }
        goto LAB_0012f54c;
      }
      local_60.has_override = false;
      local_60._17_7_ = 0;
      local_60.override_file = (char *)0x0;
      local_60.override_line = 0;
      local_60.override_column = 0;
      local_60.type = FYET_ERROR;
      local_60.module = FYEM_SCAN;
      pfVar4 = fy_fill_atom_at(fyp,0,1,&local_a8);
      local_60.fyt = fy_token_create(FYTT_INPUT_MARKER,pfVar4);
      pcVar8 = "wrongly indented mapping key in flow mode";
    }
    fy_parser_diag_report(fyp,&local_60,pcVar8);
  }
  else {
    pcVar8 = "illegal block entry or key mark";
    iVar3 = 0x786;
LAB_0012f54c:
    *(undefined8 *)((long)pfVar5 + -8) = 0x12f553;
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,iVar3,"fy_fetch_key",pcVar8);
  }
  return -1;
}

Assistant:

int fy_fetch_key(struct fy_parser *fyp, int c) {
    int rc;
    struct fy_mark mark;
    struct fy_simple_key_mark skm;
    bool target_simple_key_allowed;
    struct fy_token *fyt;

    fyp_error_check(fyp, c == '?', err_out,
                    "illegal block entry or key mark");

    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fyp->flow_level || fyp->column > fyp->indent, err_out,
                          "wrongly indented mapping key in flow mode");

    fy_get_simple_key_mark(fyp, &skm);

    /* we have to save the start mark */
    fy_get_mark(fyp, &mark);

    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          fyp->flow_level || fyp->simple_key_allowed, err_out,
                          "invalid mapping key (not allowed in this context)");

    if (!fyp->flow_level && fyp->indent < fyp->column) {

        /* push the new indent level */
        rc = fy_push_indent(fyp, fyp->column, true);
        fyp_error_check(fyp, !rc, err_out_rc,
                        "fy_push_indent() failed");

        fyt = fy_token_queue_internal(fyp, &fyp->queued_tokens,
                                      FYTT_BLOCK_MAPPING_START, fy_fill_atom_a(fyp, 0));
        fyp_error_check(fyp, fyt, err_out_rc,
                        "fy_token_queue_internal() failed");
    }

    rc = fy_remove_simple_key(fyp, FYTT_KEY);
    fyp_error_check(fyp, !rc, err_out_rc,
                    "fy_remove_simple_key() failed");

    target_simple_key_allowed = !fyp->flow_level;

    fyp->pending_complex_key_column = fyp->column;
    fyp->pending_complex_key_mark = mark;
    fyp_scan_debug(fyp, "pending_complex_key_column %d",
                   fyp->pending_complex_key_column);

    fyt = fy_token_queue(fyp, FYTT_KEY, fy_fill_atom_a(fyp, 1));
    fyp_error_check(fyp, fyt, err_out_rc,
                    "fy_token_queue() failed");

    fyp->simple_key_allowed = target_simple_key_allowed;
    fyp_scan_debug(fyp, "simple_key_allowed -> %s\n", fyp->simple_key_allowed ? "true" : "false");

    /* eat whitespace */
    while (fy_is_blank(c = fy_parse_peek(fyp)))
        fy_advance(fyp, c);

    /* comment? */
    if (c == '#') {
        rc = fy_scan_comment(fyp, &fyt->comment[fycp_right], false);
        fyp_error_check(fyp, !rc, err_out_rc,
                        "fy_scan_comment() failed");
    }

    return 0;

    err_out:
    rc = -1;
    err_out_rc:
    return rc;
}